

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O1

void test_convert<float,double>(uint length,float value)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr<float> pt;
  shared_ptr<double> pu;
  
  iVar2 = posix_memalign(&pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                         ,0x10,(long)(int)length * 4);
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar2 == 0) {
    local_40 = pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt,local_40,sse::common::free<float>);
  iVar2 = posix_memalign(&local_48,0x10,(long)(int)length << 3);
  pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar2 == 0) {
    pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_48;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu,
             pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<double>);
  p_Var4 = local_40;
  uVar7 = length;
  uVar5 = length;
  if (0xf < (int)length) {
    do {
      *(float *)&p_Var4->_vptr__Sp_counted_base = value;
      *(float *)((long)&p_Var4->_vptr__Sp_counted_base + 4) = value;
      p_Var4->_M_use_count = (_Atomic_word)value;
      p_Var4->_M_weak_count = (_Atomic_word)value;
      *(float *)&p_Var4[1]._vptr__Sp_counted_base = value;
      *(float *)((long)&p_Var4[1]._vptr__Sp_counted_base + 4) = value;
      p_Var4[1]._M_use_count = (_Atomic_word)value;
      p_Var4[1]._M_weak_count = (_Atomic_word)value;
      *(float *)&p_Var4[2]._vptr__Sp_counted_base = value;
      *(float *)((long)&p_Var4[2]._vptr__Sp_counted_base + 4) = value;
      p_Var4[2]._M_use_count = (_Atomic_word)value;
      p_Var4[2]._M_weak_count = (_Atomic_word)value;
      *(float *)&p_Var4[3]._vptr__Sp_counted_base = value;
      *(float *)((long)&p_Var4[3]._vptr__Sp_counted_base + 4) = value;
      p_Var4[3]._M_use_count = (_Atomic_word)value;
      p_Var4[3]._M_weak_count = (_Atomic_word)value;
      uVar5 = uVar7 - 0x10;
      p_Var4 = p_Var4 + 4;
      bVar1 = 0x1f < (int)uVar7;
      uVar7 = uVar5;
    } while (bVar1);
  }
  if (7 < (int)uVar5) {
    *(float *)&p_Var4->_vptr__Sp_counted_base = value;
    *(float *)((long)&p_Var4->_vptr__Sp_counted_base + 4) = value;
    p_Var4->_M_use_count = (_Atomic_word)value;
    p_Var4->_M_weak_count = (_Atomic_word)value;
    *(float *)&p_Var4[1]._vptr__Sp_counted_base = value;
    *(float *)((long)&p_Var4[1]._vptr__Sp_counted_base + 4) = value;
    p_Var4[1]._M_use_count = (_Atomic_word)value;
    p_Var4[1]._M_weak_count = (_Atomic_word)value;
    uVar5 = uVar5 - 8;
    p_Var4 = p_Var4 + 2;
  }
  if (3 < (int)uVar5) {
    *(float *)&p_Var4->_vptr__Sp_counted_base = value;
    *(float *)((long)&p_Var4->_vptr__Sp_counted_base + 4) = value;
    p_Var4->_M_use_count = (_Atomic_word)value;
    p_Var4->_M_weak_count = (_Atomic_word)value;
    uVar5 = uVar5 - 4;
    p_Var4 = p_Var4 + 1;
  }
  if (0 < (int)uVar5) {
    iVar2 = uVar5 + 1;
    do {
      *(float *)&p_Var4->_vptr__Sp_counted_base = value;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var4->_vptr__Sp_counted_base + 4);
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  if (0 < (int)length) {
    uVar6 = 0;
    do {
      (&(pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar6] =
           (_func_int **)(double)*(float *)((long)&local_40->_vptr__Sp_counted_base + uVar6 * 4);
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
  }
  if (length != 0) {
    uVar6 = 0;
    do {
      dVar9 = (double)(&(pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base)[uVar6] - (double)value;
      uVar8 = -(ulong)(dVar9 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar8 & (ulong)dVar9 |
                  (ulong)((double)value -
                         (double)(&(pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar6]) & uVar8)) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_convert(unsigned int, _T) [_T = float, _U = double]";
        *(undefined4 *)(puVar3 + 1) = 0x17;
        *(uint *)((long)puVar3 + 0xc) = length;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
  }
  if (pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}